

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryRequirementsTests.cpp
# Opt level: O0

string * __thiscall
vkt::memory::(anonymous_namespace)::getImageInfoString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VkImageCreateInfo *imageInfo)

{
  int iVar1;
  ostream *poVar2;
  ostringstream local_190 [8];
  ostringstream str;
  VkImageCreateInfo *imageInfo_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  iVar1 = *(int *)(this + 0x14);
  if (iVar1 == 0) {
    std::operator<<((ostream *)local_190,"1D ");
  }
  else if (iVar1 == 1) {
    std::operator<<((ostream *)local_190,"2D ");
  }
  else if (iVar1 == 2) {
    std::operator<<((ostream *)local_190,"3D ");
  }
  if (*(int *)(this + 0x34) == 0) {
    std::operator<<((ostream *)local_190,"(optimal) ");
  }
  else if (*(int *)(this + 0x34) == 1) {
    std::operator<<((ostream *)local_190,"(linear) ");
  }
  poVar2 = std::operator<<((ostream *)local_190,"extent:[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(this + 0x1c));
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(this + 0x20));
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(this + 0x24));
  std::operator<<(poVar2,"] ");
  poVar2 = ::vk::operator<<((ostream *)local_190,*(VkFormat *)(this + 0x18));
  std::operator<<(poVar2," ");
  poVar2 = std::operator<<((ostream *)local_190,"samples:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(this + 0x30));
  std::operator<<(poVar2," ");
  poVar2 = std::operator<<((ostream *)local_190,"flags:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(this + 0x10));
  std::operator<<(poVar2," ");
  poVar2 = std::operator<<((ostream *)local_190,"usage:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(this + 0x38));
  std::operator<<(poVar2," ");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string getImageInfoString (const VkImageCreateInfo& imageInfo)
{
	std::ostringstream str;

	switch (imageInfo.imageType)
	{
		case VK_IMAGE_TYPE_1D:			str << "1D "; break;
		case VK_IMAGE_TYPE_2D:			str << "2D "; break;
		case VK_IMAGE_TYPE_3D:			str << "3D "; break;
		default:						break;
	}

	switch (imageInfo.tiling)
	{
		case VK_IMAGE_TILING_OPTIMAL:	str << "(optimal) "; break;
		case VK_IMAGE_TILING_LINEAR:	str << "(linear) "; break;
		default:						break;
	}

	str << "extent:[" << imageInfo.extent.width << ", " << imageInfo.extent.height << ", " << imageInfo.extent.depth << "] ";
	str << imageInfo.format << " ";
	str << "samples:" << static_cast<deUint32>(imageInfo.samples) << " ";
	str << "flags:" << static_cast<deUint32>(imageInfo.flags) << " ";
	str << "usage:" << static_cast<deUint32>(imageInfo.usage) << " ";

	return str.str();
}